

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction
          (ConversionStream *this,Char *FuncName,bool *bTakesInputPatch)

{
  TokenListType *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  StorageQualifier SVar4;
  int iVar5;
  pointer pcVar6;
  size_type sVar7;
  ShaderParameterInfo *pSVar8;
  HLSL2GLSLConverterImpl *pHVar9;
  uint uVar10;
  undefined8 __position;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var11;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var12;
  int iVar13;
  size_t sVar14;
  ostream *poVar15;
  __node_base_ptr p_Var16;
  char (*in_RCX) [32];
  long lVar17;
  ConversionStream *pCVar18;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  char cVar22;
  _Alloc_hider _Var23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *SubstituteInstName;
  _Hash_node_base *p_Var24;
  char *__end;
  uint uVar25;
  pointer pSVar26;
  bool bIsVoid;
  iterator Token;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  iterator FirstStatementToken;
  String Prologue;
  string msg_1;
  iterator TypeToken;
  iterator EntryPointToken;
  char *EntryPoint;
  iterator ArgsListEndToken;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  Params;
  stringstream PrologueSS;
  stringstream ReturnHandlerSS;
  char local_522;
  bool local_521;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_520;
  String local_518;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_4f8;
  iterator iStack_4f0;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  long local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [9];
  char acStack_49f [15];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_458;
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  undefined1 local_408 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  pointer local_360;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  local_358;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base aiStack_138 [264];
  
  pTVar1 = &this->m_Tokens;
  local_520._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar5 = *(int *)&local_520._M_node[1]._M_next;
  if (iVar5 == 0x133) {
    local_520._M_node = (local_520._M_node)->_M_next;
  }
  uVar19 = (uint)(iVar5 == 0x133);
  _Var11._M_node = (_List_node_base *)pTVar1;
  local_460._M_p = (pointer)this;
  local_3d0._8_8_ = FuncName;
  local_408._16_8_ = bTakesInputPatch;
  uVar10 = uVar19;
  _Var12._M_node = local_520._M_node;
  while (local_520._M_node = _Var12._M_node, local_450._8_8_ = _Var11._M_node, uVar25 = uVar10,
        local_520._M_node != (_List_node_base *)pTVar1) {
    iVar13 = *(int *)&local_520._M_node[1]._M_next;
    if (iVar13 == 0x134) {
      uVar25 = uVar10 - 1;
      in_RCX = (char (*) [32])(ulong)uVar25;
      if ((int)uVar10 <= (int)uVar19) break;
    }
    else if (iVar13 == 0x133) {
      uVar25 = uVar10 + 1;
    }
    uVar10 = uVar25;
    if ((iVar13 != 0x13b || uVar25 != 0) ||
       (iVar13 = std::__cxx11::string::compare((char *)&local_520._M_node[1]._M_prev),
       _Var11._M_node = local_520._M_node, _Var12._M_node = (_List_node_base *)pTVar1, iVar13 != 0))
    {
      _Var11._M_node = (_List_node_base *)local_450._8_8_;
      _Var12._M_node =
           (((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)&(local_520._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    }
  }
  if (iVar5 == 0x133) {
    if (local_520._M_node == (_List_node_base *)pTVar1) {
      FormatString<char[38]>
                ((string *)local_340,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)local_1b8,(ConversionStream *)local_460._M_p,&local_520,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
      in_RCX = (char (*) [32])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,in_R8,(char (*) [2])0x33bd33,(String *)local_1b8);
      if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                        local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&local_520._M_node[1]._M_next == 0x134) goto LAB_001fe0c6;
    FormatString<char[26],char[32]>
              ((string *)local_340,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",in_RCX);
    DebugAssertionFailed
              ((Char *)local_340._0_8_,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar25 == 0) goto LAB_001fe0c6;
    FormatString<char[20]>((string *)local_340,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,(ConversionStream *)local_460._M_p,&local_520,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,in_R8,(char (*) [2])0x33bd33,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
LAB_001fe0c6:
  if ((TokenListType *)local_450._8_8_ == pTVar1) {
    local_1b8[0] = (stringstream)0x22;
    FormatString<char[47],char_const*,char>
              ((string *)local_340,(Diligent *)"Unable to find hull shader constant function \"",
               (char (*) [47])(local_3d0._M_local_buf + 8),(char **)local_1b8,(char *)in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,(ConversionStream *)local_460._M_p,
               (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)(local_450 + 8),4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd3a,in_R8,(char (*) [2])0x33bd33,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  local_420 = (pointer)(((unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
                          *)(local_450._8_8_ + 0x18))->_M_h)._M_buckets;
  local_458._M_node = *(_List_node_base **)(local_450._8_8_ + 8);
  if (local_458._M_node ==
      (pTVar1->
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      )._M_impl._M_node.super__List_node_base._M_next) {
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)local_340,(Diligent *)"Function \"",(char (*) [11])(local_450._8_8_ + 0x18)
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                "\" misses return type",(char (*) [21])in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)local_1b8,(ConversionStream *)local_460._M_p,&local_458,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd42,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340
               ,(char (*) [2])0x33bd33,(String *)local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                      local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d0._M_allocated_capacity = (size_type)local_458._M_node;
  local_521 = false;
  ProcessFunctionParameters
            ((ConversionStream *)local_460._M_p,(iterator *)&local_3d0._M_allocated_capacity,
             &local_358,&local_521);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  local_450._0_8_ = pTVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar15 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"#define ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"_CONST_FUNC_RETURN_",0x13);
  pcVar20 = "(_RET_VAL_)";
  if (local_521 != false) {
    pcVar20 = "";
  }
  lVar17 = 0xb;
  if (local_521 != false) {
    lVar17 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar20,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," {\\\n",4);
  *(bool *)local_408._16_8_ = false;
  local_360 = local_358.
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_358.
      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_358.
      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar26 = local_358.
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      SVar4 = pSVar26->storageQualifier;
      if ((SVar4 == Ret) || (SVar4 == Out)) {
        local_518._M_dataplus._M_p = (pointer)0x0;
        local_518._M_string_length = 0;
        local_518.field_2._M_allocated_capacity = 0;
        local_4e8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_4f8._M_node = (_List_node_base *)0x0;
        iStack_4f0._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_4b8._0_8_ = pSVar26;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_518,(iterator)0x0,(ShaderParameterInfo **)local_4b8);
        local_4b8._0_8_ =
             (pSVar26->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_4f0._M_current == local_4e8) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_4f8,iStack_4f0,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_4b8);
        }
        else {
          (iStack_4f0._M_current)->_M_current = (ShaderParameterInfo *)local_4b8._0_8_;
          iStack_4f0._M_current = iStack_4f0._M_current + 1;
        }
        if (((pSVar26->storageQualifier != Ret) && ((pSVar26->GSAttribs).PrimType == Undefined)) &&
           ((pSVar26->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),"    ",4)
          ;
          pcVar20 = (pSVar26->Type)._M_dataplus._M_p;
          if (pcVar20 == (char *)0x0) {
            std::ios::clear((int)local_340 + 0x10 +
                            (int)*(undefined8 *)(local_330[0]._M_allocated_capacity - 0x18));
          }
          else {
            sVar14 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),pcVar20,sVar14);
          }
          local_4b8[0] = 0x20;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_340 + 0x10),(char *)local_4b8,1);
          pcVar20 = (pSVar26->Name)._M_dataplus._M_p;
          if (pcVar20 == (char *)0x0) {
            std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar20,sVar14);
          }
          if ((pSVar26->ArraySize)._M_string_length != 0) {
            local_4b8[0] = kw_min16float1x2;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_340 + 0x10),(char *)local_4b8,1);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(pSVar26->ArraySize)._M_dataplus._M_p,
                                 (pSVar26->ArraySize)._M_string_length);
            local_4b8[0] = 0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)local_4b8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_340 + 0x10),";\n",2);
        }
        while (local_518._M_dataplus._M_p != (pointer)local_518._M_string_length) {
          pcVar20 = *(char **)(local_518._M_string_length + -8);
          if (*(ShaderParameterInfo **)(pcVar20 + 0x88) == *(ShaderParameterInfo **)(pcVar20 + 0x90)
             ) {
            if (iStack_4f0._M_current[-1]._M_current != *(ShaderParameterInfo **)(pcVar20 + 0x90)) {
              FormatString<char[26],char[49]>
                        ((string *)local_4b8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])iStack_4f0._M_current);
              DebugAssertionFailed
                        ((Char *)local_4b8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
                operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
              }
            }
            if (*(long *)(pcVar20 + 0x70) == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar20 + 0x48),(char (*) [2])0x353674);
            }
            local_4d8 = &local_4c8;
            local_4d0 = 0;
            local_4c8._M_local_buf[0] = '\0';
            pHVar9 = *(HLSL2GLSLConverterImpl **)(local_460._M_p + 0xb8);
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_4b8,
                       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (pcVar20 + 0x68))->_M_dataplus)._M_p,false);
            pCVar18 = (ConversionStream *)
                      ((local_4b8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar9->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var16 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar9->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[1]._M_h,
                                 (size_type)pCVar18,(key_type *)local_4b8,
                                 local_4b8._8_8_ & 0x7fffffffffffffff);
            if (p_Var16 == (__node_base_ptr)0x0) {
              p_Var24 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var24 = p_Var16->_M_nxt;
            }
            if (((pointer)local_4b8._0_8_ != (pointer)0x0) && ((long)local_4b8._8_8_ < 0)) {
              operator_delete__((void *)local_4b8._0_8_);
            }
            if (p_Var24 != (_Hash_node_base *)0x0) {
              pCVar18 = (ConversionStream *)(p_Var24 + 3);
              std::__cxx11::string::_M_assign((string *)&local_4d8);
            }
            SubstituteInstName = "";
            if (*pcVar20 == '\x04') {
              SubstituteInstName = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_
                      ((String *)local_4b8,pCVar18,
                       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                        *)&local_518,'.',"",SubstituteInstName,"");
            if (local_4d0 == 0) {
              LogError<true,char[120],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xd82,(char (*) [120])
                                "Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\nVariable \""
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pcVar20 + 0x48),(char (*) [18])"\" with semantic \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar20 + 0x68),(char (*) [19])"\" is not supported");
            }
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1b8 + 0x10),local_4d8->_M_local_buf,local_4d0);
            local_522 = '(';
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_522,1);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(char *)local_4b8._0_8_,local_4b8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,");\\\n",4);
            if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
              operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
            }
            local_518._M_string_length = local_518._M_string_length + -8;
            iStack_4f0._M_current = iStack_4f0._M_current + -1;
            if (local_4d8 != &local_4c8) {
              operator_delete(local_4d8,
                              CONCAT71(local_4c8._M_allocated_capacity._1_7_,
                                       local_4c8._M_local_buf[0]) + 1);
            }
          }
          else {
            if (*(long *)(pcVar20 + 0x70) != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pcVar20 + 0x48),(char (*) [2])0x353674);
            }
            pSVar8 = iStack_4f0._M_current[-1]._M_current;
            if (pSVar8 == *(ShaderParameterInfo **)(pcVar20 + 0x90)) {
              local_518._M_string_length = local_518._M_string_length + -8;
              iStack_4f0._M_current = iStack_4f0._M_current + -1;
            }
            else {
              iStack_4f0._M_current[-1]._M_current = pSVar8 + 1;
              if (local_518._M_string_length == local_518.field_2._M_allocated_capacity) {
                local_4b8._0_8_ = pSVar8;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_518,(iterator)local_518._M_string_length,
                           (ShaderParameterInfo **)local_4b8);
              }
              else {
                *(ShaderParameterInfo **)local_518._M_string_length = pSVar8;
                local_518._M_string_length = local_518._M_string_length + 8;
              }
              local_4b8._0_8_ =
                   (pSVar8->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_4f0._M_current == local_4e8) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_4f8,iStack_4f0,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_4b8);
              }
              else {
                (iStack_4f0._M_current)->_M_current = (ShaderParameterInfo *)local_4b8._0_8_;
                iStack_4f0._M_current = iStack_4f0._M_current + 1;
              }
            }
          }
        }
LAB_001fea3d:
        if (local_4f8._M_node != (_List_node_base *)0x0) {
          operator_delete(local_4f8._M_node,(long)local_4e8 - (long)local_4f8._M_node);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar21 = local_518.field_2._M_allocated_capacity - (long)local_518._M_dataplus._M_p;
          _Var23._M_p = local_518._M_dataplus._M_p;
LAB_001fea6b:
          operator_delete(_Var23._M_p,uVar21);
        }
      }
      else if (SVar4 == In) {
        if ((pSVar26->HSAttribs).PatchType != InputPatch) {
          local_518._M_dataplus._M_p = (pointer)0x0;
          local_518._M_string_length = 0;
          local_518.field_2._M_allocated_capacity = 0;
          local_4e8 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                       *)0x0;
          local_4f8._M_node = (_List_node_base *)0x0;
          iStack_4f0._M_current =
               (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                *)0x0;
          local_4b8._0_8_ = pSVar26;
          std::
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
          ::
          _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                    ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                      *)&local_518,(iterator)0x0,(ShaderParameterInfo **)local_4b8);
          local_4b8._0_8_ =
               (pSVar26->members).
               super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if (iStack_4f0._M_current == local_4e8) {
            std::
            vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
            ::
            _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                      ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                        *)&local_4f8,iStack_4f0,
                       (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                        *)local_4b8);
          }
          else {
            (iStack_4f0._M_current)->_M_current = (ShaderParameterInfo *)local_4b8._0_8_;
            iStack_4f0._M_current = iStack_4f0._M_current + 1;
          }
          if (((pSVar26->storageQualifier != Ret) && ((pSVar26->GSAttribs).PrimType == Undefined))
             && ((pSVar26->HSAttribs).PatchType == Undefined)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),"    ",4);
            pcVar20 = (pSVar26->Type)._M_dataplus._M_p;
            if (pcVar20 == (char *)0x0) {
              std::ios::clear((int)local_340 + 0x10 +
                              (int)*(undefined8 *)(local_330[0]._M_allocated_capacity - 0x18));
            }
            else {
              sVar14 = strlen(pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_340 + 0x10),pcVar20,sVar14);
            }
            local_4b8[0] = 0x20;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_340 + 0x10),(char *)local_4b8,1);
            pcVar20 = (pSVar26->Name)._M_dataplus._M_p;
            if (pcVar20 == (char *)0x0) {
              std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
            }
            else {
              sVar14 = strlen(pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar20,sVar14);
            }
            if ((pSVar26->ArraySize)._M_string_length != 0) {
              local_4b8[0] = kw_min16float1x2;
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_340 + 0x10),(char *)local_4b8,1);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(pSVar26->ArraySize)._M_dataplus._M_p,
                                   (pSVar26->ArraySize)._M_string_length);
              local_4b8[0] = 0x5d;
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)local_4b8,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_340 + 0x10),";\n",2);
          }
          while (local_518._M_dataplus._M_p != (pointer)local_518._M_string_length) {
            sVar7 = *(size_type *)(local_518._M_string_length + -8);
            if (*(ShaderParameterInfo **)(sVar7 + 0x88) == *(ShaderParameterInfo **)(sVar7 + 0x90))
            {
              if (iStack_4f0._M_current[-1]._M_current != *(ShaderParameterInfo **)(sVar7 + 0x90)) {
                FormatString<char[26],char[49]>
                          ((string *)local_4b8,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                           (char (*) [49])iStack_4f0._M_current);
                DebugAssertionFailed
                          ((Char *)local_4b8._0_8_,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb19);
                if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
                  operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
                }
              }
              if (*(long *)(sVar7 + 0x70) == 0) {
                LogError<true,char[36],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar7 + 0x48),(char (*) [2])0x353674);
              }
              local_4d8 = &local_4c8;
              local_4d0 = 0;
              local_4c8._M_local_buf[0] = '\0';
              pHVar9 = *(HLSL2GLSLConverterImpl **)(local_460._M_p + 0xb8);
              HashMapStringKey::HashMapStringKey
                        ((HashMapStringKey *)local_4b8,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (sVar7 + 0x68))->_M_dataplus)._M_p,false);
              pCVar18 = (ConversionStream *)
                        ((local_4b8._8_8_ & 0x7fffffffffffffff) %
                        (pHVar9->m_HLSLSemanticToGLSLVar)._M_elems[3]._M_elems[0]._M_h.
                        _M_bucket_count);
              p_Var16 = std::
                        _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((pHVar9->m_HLSLSemanticToGLSLVar)._M_elems + 3),
                                   (size_type)pCVar18,(key_type *)local_4b8,
                                   local_4b8._8_8_ & 0x7fffffffffffffff);
              if (p_Var16 == (__node_base_ptr)0x0) {
                p_Var24 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var24 = p_Var16->_M_nxt;
              }
              if (((pointer)local_4b8._0_8_ != (pointer)0x0) && ((long)local_4b8._8_8_ < 0)) {
                operator_delete__((void *)local_4b8._0_8_);
              }
              if (p_Var24 != (_Hash_node_base *)0x0) {
                pCVar18 = (ConversionStream *)(p_Var24 + 3);
                std::__cxx11::string::_M_assign((string *)&local_4d8);
              }
              BuildParameterName_abi_cxx11_
                        ((String *)local_4b8,pCVar18,
                         (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          *)&local_518,'.',"","","");
              if (local_4d0 == 0) {
                LogError<true,char[115],std::__cxx11::string,char[18],std::__cxx11::string,char[19]>
                          (false,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xd6f,(char (*) [115])
                                  "Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\nVariable \""
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (sVar7 + 0x48),(char (*) [18])"\" with semantic \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar7 + 0x68),(char (*) [19])"\" is not supported");
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_340 + 0x10),"    ",4);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_340 + 0x10),local_4d8->_M_local_buf,local_4d0);
              local_522 = '(';
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_522,1);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,(char *)local_4b8._0_8_,local_4b8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,");\n",3);
              if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
                operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
              }
              local_518._M_string_length = local_518._M_string_length + -8;
              iStack_4f0._M_current = iStack_4f0._M_current + -1;
              if (local_4d8 != &local_4c8) {
                operator_delete(local_4d8,
                                CONCAT71(local_4c8._M_allocated_capacity._1_7_,
                                         local_4c8._M_local_buf[0]) + 1);
              }
            }
            else {
              if (*(long *)(sVar7 + 0x70) != 0) {
                LogError<true,char[35],std::__cxx11::string,char[2]>
                          (false,"ProcessShaderArgument",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (sVar7 + 0x48),(char (*) [2])0x353674);
              }
              pSVar8 = iStack_4f0._M_current[-1]._M_current;
              if (pSVar8 == *(ShaderParameterInfo **)(sVar7 + 0x90)) {
                local_518._M_string_length = local_518._M_string_length + -8;
                iStack_4f0._M_current = iStack_4f0._M_current + -1;
              }
              else {
                iStack_4f0._M_current[-1]._M_current = pSVar8 + 1;
                if (local_518._M_string_length == local_518.field_2._M_allocated_capacity) {
                  local_4b8._0_8_ = pSVar8;
                  std::
                  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                  ::
                  _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                            ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                              *)&local_518,(iterator)local_518._M_string_length,
                             (ShaderParameterInfo **)local_4b8);
                }
                else {
                  *(ShaderParameterInfo **)local_518._M_string_length = pSVar8;
                  local_518._M_string_length = local_518._M_string_length + 8;
                }
                local_4b8._0_8_ =
                     (pSVar8->members).
                     super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (iStack_4f0._M_current == local_4e8) {
                  std::
                  vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                  ::
                  _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                            ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                              *)&local_4f8,iStack_4f0,
                             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                              *)local_4b8);
                }
                else {
                  (iStack_4f0._M_current)->_M_current = (ShaderParameterInfo *)local_4b8._0_8_;
                  iStack_4f0._M_current = iStack_4f0._M_current + 1;
                }
              }
            }
          }
          goto LAB_001fea3d;
        }
        *(bool *)local_408._16_8_ = true;
        local_4d8 = &local_4c8;
        pcVar6 = (pSVar26->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d8,pcVar6,pcVar6 + (pSVar26->Type)._M_string_length);
        cVar22 = (char)(string *)&local_4d8;
        std::__cxx11::string::push_back(cVar22);
        std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)(pSVar26->Name)._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar22);
        std::__cxx11::string::_M_append
                  ((char *)&local_4d8,(ulong)(pSVar26->ArraySize)._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar22);
        __position = local_3d0._M_allocated_capacity;
        std::__cxx11::string::string
                  ((string *)&local_418,local_4d8->_M_local_buf,(allocator *)&local_518);
        local_440._M_p = (pointer)&local_430;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"","");
        local_4b8._0_4_ = 0x143;
        local_4b8._8_8_ = local_4a8 + 8;
        if (local_418 == (pointer)local_408) {
          acStack_49f[7] = local_408[8];
          acStack_49f[8] = local_408[9];
          acStack_49f[9] = local_408[10];
          acStack_49f[10] = local_408[0xb];
          acStack_49f[0xb] = local_408[0xc];
          acStack_49f[0xc] = local_408[0xd];
          acStack_49f[0xd] = local_408[0xe];
          acStack_49f[0xe] = local_408[0xf];
        }
        else {
          local_4b8._8_8_ = local_418;
        }
        acStack_49f._0_7_ = local_408._1_7_;
        local_4a8[8] = local_408[0];
        local_4a8._0_8_ = local_410;
        local_410 = (pointer)0x0;
        local_408[0] = '\0';
        local_490._M_allocated_capacity = (size_type)&local_480;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_p == &local_430) {
          local_480._8_8_ = local_430._8_8_;
        }
        else {
          local_490._M_allocated_capacity = (size_type)local_440._M_p;
        }
        local_480._M_allocated_capacity._1_7_ = local_430._M_allocated_capacity._1_7_;
        local_480._M_local_buf[0] = local_430._M_local_buf[0];
        local_490._8_8_ = local_438;
        local_438 = 0;
        local_430._M_local_buf[0] = '\0';
        local_470._M_allocated_capacity = 0xffffffffffffffff;
        local_440._M_p = (pointer)&local_430;
        local_418 = (pointer)local_408;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        emplace<Diligent::Parsing::HLSLTokenInfo>
                  ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    *)local_450._0_8_,(const_iterator)__position,(HLSLTokenInfo *)local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_allocated_capacity != &local_480) {
          operator_delete((void *)local_490._M_allocated_capacity,
                          local_480._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_4b8._8_8_ != local_4a8 + 8) {
          operator_delete((void *)local_4b8._8_8_,stack0xfffffffffffffb60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_p != &local_430) {
          operator_delete(local_440._M_p,
                          CONCAT71(local_430._M_allocated_capacity._1_7_,local_430._M_local_buf[0])
                          + 1);
        }
        if (local_418 != (pointer)local_408) {
          operator_delete(local_418,CONCAT71(local_408._1_7_,local_408[0]) + 1);
        }
        if (local_4d8 == &local_4c8) goto LAB_001fea70;
        uVar21 = CONCAT71(local_4c8._M_allocated_capacity._1_7_,local_4c8._M_local_buf[0]) + 1;
        _Var23._M_p = (pointer)local_4d8;
        goto LAB_001fea6b;
      }
LAB_001fea70:
      pSVar26 = pSVar26 + 1;
    } while (pSVar26 != local_360);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"return;}\n",9);
  _Var11._M_node = local_458._M_node;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_380,local_4d8->_M_local_buf,(allocator *)&local_518)
  ;
  std::__cxx11::string::string
            ((string *)&local_3a0,(char *)local_458._M_node[3]._M_prev,(allocator *)&local_4f8);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_4a8 + 8);
  local_4b8._0_4_ = 0x143;
  if (local_380 == &local_370) {
    acStack_49f[7] = local_370._M_local_buf[8];
    acStack_49f[8] = local_370._M_local_buf[9];
    acStack_49f[9] = local_370._M_local_buf[10];
    acStack_49f[10] = local_370._M_local_buf[0xb];
    acStack_49f[0xb] = local_370._M_local_buf[0xc];
    acStack_49f[0xc] = local_370._M_local_buf[0xd];
    acStack_49f[0xd] = local_370._M_local_buf[0xe];
    acStack_49f[0xe] = local_370._M_local_buf[0xf];
    local_4b8._8_8_ = paVar2;
  }
  else {
    local_4b8._8_8_ = local_380;
  }
  acStack_49f._0_7_ = local_370._M_allocated_capacity._1_7_;
  local_4a8[8] = local_370._M_local_buf[0];
  local_4a8._0_8_ = local_378;
  local_378 = 0;
  local_370._M_local_buf[0] = '\0';
  if (local_3a0 == &local_390) {
    local_480._8_8_ = local_390._8_8_;
    local_490._M_allocated_capacity = (size_type)&local_480;
  }
  else {
    local_490._M_allocated_capacity = (size_type)local_3a0;
  }
  local_480._M_allocated_capacity._1_7_ = local_390._M_allocated_capacity._1_7_;
  local_480._M_local_buf[0] = local_390._M_local_buf[0];
  local_490._8_8_ = local_398;
  local_398 = 0;
  local_390._M_local_buf[0] = '\0';
  local_470._M_allocated_capacity = 0xffffffffffffffff;
  local_3a0 = &local_390;
  local_380 = &local_370;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)local_450._0_8_,(const_iterator)_Var11._M_node,(HLSLTokenInfo *)local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_allocated_capacity != &local_480) {
    operator_delete((void *)local_490._M_allocated_capacity,local_480._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._8_8_ != paVar2) {
    operator_delete((void *)local_4b8._8_8_,stack0xfffffffffffffb60 + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,
                    CONCAT71(local_390._M_allocated_capacity._1_7_,local_390._M_local_buf[0]) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,
                    CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,
                    CONCAT71(local_4c8._M_allocated_capacity._1_7_,local_4c8._M_local_buf[0]) + 1);
  }
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::_M_replace
            ((ulong)&local_458._M_node[3]._M_prev,0,(char *)local_458._M_node[4]._M_next,0x33bd33);
  std::__cxx11::stringbuf::str();
  local_520._M_node = *(_List_node_base **)local_3d0._M_allocated_capacity;
  if (local_520._M_node == (_List_node_base *)local_450._0_8_) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_4b8,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])&local_420,(char **)0x35354d,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_518,(ConversionStream *)local_460._M_p,&local_520,4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd93,Args,(char (*) [2])0x33bd33,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4b8._0_8_ != local_4a8) {
      operator_delete((void *)local_4b8._0_8_,local_4a8._0_8_ + 1);
    }
  }
  if (*(int *)&local_520._M_node[1]._M_next != 0x133) {
    FormatString<char[13]>((string *)local_4b8,(char (*) [13])"\'{\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_518,(ConversionStream *)local_460._M_p,&local_520,4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd94,Args,(char (*) [2])0x33bd33,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4b8._0_8_ != local_4a8) {
      operator_delete((void *)local_4b8._0_8_,local_4a8._0_8_ + 1);
    }
  }
  local_4f8._M_node = (local_520._M_node)->_M_next;
  if (local_4f8._M_node == (_List_node_base *)local_450._0_8_) {
    FormatString<char[55],char_const*,char[3]>
              ((string *)local_4b8,
               (Diligent *)"Unexpected end of file while looking for the body of \"",
               (char (*) [55])&local_420,(char **)0x35354d,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_518,(ConversionStream *)local_460._M_p,&local_4f8,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessHullShaderConstantFunction",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd9c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8
               ,(char (*) [2])0x33bd33,&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_4b8._0_8_ != local_4a8) {
      operator_delete((void *)local_4b8._0_8_,local_4a8._0_8_ + 1);
    }
  }
  _Var11._M_node = local_4f8._M_node;
  std::__cxx11::string::string((string *)&local_3c0,local_4d8->_M_local_buf,(allocator *)&local_518)
  ;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_408 + 0x28);
  local_3f0 = paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_408 + 0x18),"\n","");
  local_4b8._0_4_ = TextBlock;
  if (local_3c0 == &local_3b0) {
    acStack_49f[7] = local_3b0._M_local_buf[8];
    acStack_49f[8] = local_3b0._M_local_buf[9];
    acStack_49f[9] = local_3b0._M_local_buf[10];
    acStack_49f[10] = local_3b0._M_local_buf[0xb];
    acStack_49f[0xb] = local_3b0._M_local_buf[0xc];
    acStack_49f[0xc] = local_3b0._M_local_buf[0xd];
    acStack_49f[0xd] = local_3b0._M_local_buf[0xe];
    acStack_49f[0xe] = local_3b0._M_local_buf[0xf];
    local_4b8._8_8_ = paVar2;
  }
  else {
    local_4b8._8_8_ = local_3c0;
  }
  acStack_49f._0_7_ = local_3b0._M_allocated_capacity._1_7_;
  local_4a8[8] = local_3b0._M_local_buf[0];
  local_4a8._0_8_ = local_3b8;
  local_3b8 = 0;
  local_3b0._M_local_buf[0] = '\0';
  if (local_3f0 == paVar3) {
    local_480._8_8_ = local_3e0._8_8_;
    local_490._M_allocated_capacity = (size_type)&local_480;
  }
  else {
    local_490._M_allocated_capacity = (size_type)local_3f0;
  }
  local_480._M_allocated_capacity._1_7_ = local_3e0._M_allocated_capacity._1_7_;
  local_480._M_local_buf[0] = local_3e0._M_local_buf[0];
  local_490._8_8_ = local_3e8;
  local_3e8 = 0;
  local_3e0._M_local_buf[0] = 0;
  local_470._M_allocated_capacity = 0xffffffffffffffff;
  local_3f0 = paVar3;
  local_3c0 = &local_3b0;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)local_450._0_8_,(const_iterator)_Var11._M_node,(HLSLTokenInfo *)local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_allocated_capacity != &local_480) {
    operator_delete((void *)local_490._M_allocated_capacity,local_480._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._8_8_ != paVar2) {
    operator_delete((void *)local_4b8._8_8_,stack0xfffffffffffffb60 + 1);
  }
  if (local_3f0 != paVar3) {
    operator_delete(local_3f0,
                    CONCAT71(local_3e0._M_allocated_capacity._1_7_,local_3e0._M_local_buf[0]) + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,
                    CONCAT71(local_3b0._M_allocated_capacity._1_7_,local_3b0._M_local_buf[0]) + 1);
  }
  ProcessReturnStatements
            ((ConversionStream *)local_460._M_p,&local_520,local_521,(Char *)local_420,
             "_CONST_FUNC_RETURN_");
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,
                    CONCAT71(local_4c8._M_allocated_capacity._1_7_,local_4c8._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector(&local_358);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(const Char* FuncName, bool& bTakesInputPatch)
{
    // Search for the function in the global scope
    auto EntryPointToken = m_Tokens.end();
    auto Token           = m_Tokens.begin();
    ProcessScope(
        Token, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& tkn, int ScopeDepth) //
        {
            if (ScopeDepth == 0 && tkn->Type == TokenType::Identifier && tkn->Literal == FuncName)
            {
                EntryPointToken = tkn;
                tkn             = m_Tokens.end();
            }
            else
                ++tkn;
        } //
    );
    VERIFY_PARSER_STATE(EntryPointToken, EntryPointToken != m_Tokens.end(), "Unable to find hull shader constant function \"", FuncName, '\"');
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void ConstantHS( InputPatch<VSOutput, 1> p,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> Params;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, Params, bIsVoid);
    // HS_CONSTANT_DATA_OUTPUT ConstantHS( InputPatch<VSOutput, 1> p,
    //                                     uint BlockID : SV_PrimitiveID)
    //                                                                  ^
    //                                                       ArgsListEndToken

    std::stringstream PrologueSS, ReturnHandlerSS;
    const Char*       ReturnMacroName = "_CONST_FUNC_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _CONST_FUNC_RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _CONST_FUNC_RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    bTakesInputPatch = false;
    for (const auto& TopLevelParam : Params)
    {
        if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            if (TopLevelParam.HSAttribs.PatchType == ShaderParameterInfo::HSAttributes::InOutPatchType::InputPatch)
            {
                bTakesInputPatch = true;
                String Argument(TopLevelParam.Type);
                Argument.push_back(' ');
                Argument.append(TopLevelParam.Name);
                Argument.push_back('[');
                Argument.append(TopLevelParam.ArraySize);
                Argument.push_back(']');
                m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, Argument.c_str()));
            }
            else
            {
                ProcessShaderArgument(
                    TopLevelParam, HSInd, InVar, PrologueSS,
                    [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                    {
                        String FullIndexedParamName = BuildParameterName(MemberStack, '.');
                        if (Getter.empty())
                        {
                            LOG_ERROR_AND_THROW("Supported inputs to a hull shader constant function are \"InputPatch<>\" and variables with SV_ semantic.\n"
                                                "Variable \"",
                                                Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                        }
                        PrologueSS << "    " << Getter << '(' << FullIndexedParamName << ");\n";
                    } //
                );
            }
        }
        else if (TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 TopLevelParam.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                TopLevelParam, HSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String SrcParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (Setter.empty())
                    {
                        LOG_ERROR_AND_THROW("Supported output semantics of a hull shader constant function are \"SV_TessFactor\" and \"SV_InsideTessFactor\".\n"
                                            "Variable \"",
                                            Param.Name, "\" with semantic \"", Param.Semantic, "\" is not supported");
                    }

                    // A TCS can only ever write to the per-vertex output variable that corresponds to their invocation,
                    // so writes to per-vertex outputs must be of the form vertexTexCoord[gl_InvocationID]
                    ReturnHandlerSS << Setter << '(' << SrcParamName << ");\\\n";
                } //
            );
        }
    }
    ReturnHandlerSS << "return;}\n";
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), TypeToken->Delimiter.c_str()));
    TypeToken->Delimiter = "\n";

    String Prologue = PrologueSS.str();
    Token           = ArgsListEndToken;
    ++Token;
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenBrace, "\'{\' expected");

    auto FirstStatementToken = Token;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    ProcessReturnStatements(Token, bIsVoid, EntryPoint, ReturnMacroName);
}